

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int UnixVfs_Getenv(char *zVar,jx9_context *pCtx)

{
  char *zString;
  char *zEnv;
  jx9_context *pCtx_local;
  char *zVar_local;
  
  zString = getenv(zVar);
  if (zString == (char *)0x0) {
    zVar_local._4_4_ = -1;
  }
  else {
    jx9_result_string(pCtx,zString,-1);
    zVar_local._4_4_ = 0;
  }
  return zVar_local._4_4_;
}

Assistant:

static int UnixVfs_Getenv(const char *zVar, jx9_context *pCtx)
{
	char *zEnv;
	zEnv = getenv(zVar);
	if( zEnv == 0 ){
	  return -1;
	}
	jx9_result_string(pCtx, zEnv, -1/*Compute length automatically*/);
	return JX9_OK;
}